

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

int Exorcism(Vec_Wec_t *vEsop,int nIns,int nOuts,char *pFileNameOut)

{
  abctime aVar1;
  abctime aVar2;
  char *local_438;
  char local_428 [8];
  char Buffer [1000];
  int MemTotal;
  int MemTemp;
  int TotalWords;
  int RemainderBits;
  abctime clk1;
  char *pFileNameOut_local;
  int nOuts_local;
  int nIns_local;
  Vec_Wec_t *vEsop_local;
  
  if (nIns < 1) {
    __assert_fail("nIns > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exor.c"
                  ,0x29a,"int Exorcism(Vec_Wec_t *, int, int, char *)");
  }
  g_CoverInfo.nWordsIn = (int)((ulong)(long)(nIns << 1) >> 5) + (uint)((nIns & 0xfU) != 0);
  g_CoverInfo.nWordsOut = (int)((ulong)(long)nOuts >> 5) + (uint)((nOuts & 0x1fU) != 0);
  g_CoverInfo.cIDs = 1;
  g_CoverInfo.nVarsIn = nIns;
  g_CoverInfo.nVarsOut = nOuts;
  aVar1 = Abc_Clock();
  g_CoverInfo.nCubesBefore = Vec_WecSize(vEsop);
  aVar2 = Abc_Clock();
  g_CoverInfo.TimeStart = aVar2 - aVar1;
  if (g_CoverInfo.Verbosity != 0) {
    printf("Starting cover generation time is %.2f sec\n",
           (double)((float)g_CoverInfo.TimeStart / 1e+06));
    printf("The number of cubes in the starting cover is %d\n",(ulong)(uint)g_CoverInfo.nCubesBefore
          );
  }
  if (g_CoverInfo.nCubesBefore < 0x4e21) {
    g_CoverInfo.nCubesAlloc = g_CoverInfo.nCubesBefore + 0x21;
    Buffer[0x3e0] = '\0';
    Buffer[0x3e1] = '\0';
    Buffer[0x3e2] = '\0';
    Buffer[0x3e3] = '\0';
    Buffer._996_4_ =
         AllocateCover(g_CoverInfo.nCubesAlloc,g_CoverInfo.nWordsIn,g_CoverInfo.nWordsOut);
    if (Buffer._996_4_ == 0) {
      printf("Unexpected memory allocation problem. Quitting...\n");
      vEsop_local._4_4_ = 0;
    }
    else {
      Buffer._992_4_ = Buffer._996_4_ + Buffer._992_4_;
      Buffer._996_4_ = AllocateCubeSets(g_CoverInfo.nVarsIn,g_CoverInfo.nVarsOut);
      if (Buffer._996_4_ == 0) {
        printf("Unexpected memory allocation problem. Quitting...\n");
        vEsop_local._4_4_ = 0;
      }
      else {
        Buffer._992_4_ = Buffer._996_4_ + Buffer._992_4_;
        Buffer._996_4_ = AllocateQueques((g_CoverInfo.nCubesAlloc * g_CoverInfo.nCubesAlloc) / 0x14)
        ;
        if (Buffer._996_4_ == 0) {
          printf("Unexpected memory allocation problem. Quitting...\n");
          vEsop_local._4_4_ = 0;
        }
        else {
          Buffer._992_4_ = Buffer._996_4_ + Buffer._992_4_;
          if (g_CoverInfo.Verbosity != 0) {
            printf("Dynamically allocated memory is %dK\n",
                   (long)(int)Buffer._992_4_ / 1000 & 0xffffffff,
                   (long)(int)Buffer._992_4_ % 1000 & 0xffffffff);
          }
          Abc_Clock();
          if (g_CoverInfo.Verbosity != 0) {
            printf("Generating the starting cover...\n");
          }
          AddCubesToStartingCover(vEsop);
          if (g_CoverInfo.Verbosity != 0) {
            printf("Performing minimization...\n");
          }
          aVar1 = Abc_Clock();
          ReduceEsopCover();
          aVar2 = Abc_Clock();
          g_CoverInfo.TimeMin = aVar2 - aVar1;
          if (g_CoverInfo.Verbosity != 0) {
            printf("\nMinimization time is %.2f sec\n",(double)((float)g_CoverInfo.TimeMin / 1e+06))
            ;
            printf("\nThe number of cubes after minimization is %d\n",
                   (ulong)(uint)g_CoverInfo.nCubesInUse);
          }
          local_438 = pFileNameOut;
          if (pFileNameOut == (char *)0x0) {
            local_438 = "temp.esop";
          }
          sprintf(local_428,"%s",local_438);
          WriteResultIntoFile(local_428);
          printf("Minimized cover has been written into file <%s>\n",local_428);
          DelocateCubeSets();
          DelocateCover();
          DelocateQueques();
          vEsop_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    printf("\nThe size of the starting cover is more than 20000 cubes. Quitting...\n");
    vEsop_local._4_4_ = 0;
  }
  return vEsop_local._4_4_;
}

Assistant:

int Exorcism( Vec_Wec_t * vEsop, int nIns, int nOuts, char * pFileNameOut )
{
    abctime clk1;
    int RemainderBits;
    int TotalWords;
    int MemTemp, MemTotal;

    ///////////////////////////////////////////////////////////////////////
    // STEPS of HEURISTIC ESOP MINIMIZATION
    ///////////////////////////////////////////////////////////////////////
    ///////////////////////////////////////////////////////////////////////
    // STEP 1: determine the size of the starting cover
    ///////////////////////////////////////////////////////////////////////
    assert( nIns > 0 );
    // inputs
    RemainderBits = (nIns*2)%(sizeof(unsigned)*8);
    TotalWords    = (nIns*2)/(sizeof(unsigned)*8) + (RemainderBits > 0);
    g_CoverInfo.nVarsIn  = nIns;
    g_CoverInfo.nWordsIn = TotalWords;
    // outputs
    RemainderBits = (nOuts)%(sizeof(unsigned)*8);
    TotalWords    = (nOuts)/(sizeof(unsigned)*8) + (RemainderBits > 0);
    g_CoverInfo.nVarsOut  = nOuts;
    g_CoverInfo.nWordsOut = TotalWords;
    g_CoverInfo.cIDs = 1;

    // cubes
    clk1 = Abc_Clock();
//  g_CoverInfo.nCubesBefore = CountTermsInPseudoKroneckerCover( g_Func.dd, nOuts );
    g_CoverInfo.nCubesBefore = Vec_WecSize(vEsop);
    g_CoverInfo.TimeStart = Abc_Clock() - clk1;

    if ( g_CoverInfo.Verbosity )
    {
    printf( "Starting cover generation time is %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeStart) );
    printf( "The number of cubes in the starting cover is %d\n", g_CoverInfo.nCubesBefore );
    }

    if ( g_CoverInfo.nCubesBefore > 20000 )
    {
        printf( "\nThe size of the starting cover is more than 20000 cubes. Quitting...\n" );
        return 0;
    }

    ///////////////////////////////////////////////////////////////////////
    // STEP 2: prepare internal data structures
    ///////////////////////////////////////////////////////////////////////
    g_CoverInfo.nCubesAlloc = g_CoverInfo.nCubesBefore + ADDITIONAL_CUBES; 

    // allocate cube cover
    MemTotal = 0;
    MemTemp = AllocateCover( g_CoverInfo.nCubesAlloc, g_CoverInfo.nWordsIn, g_CoverInfo.nWordsOut );
    if ( MemTemp == 0 )
    {
        printf( "Unexpected memory allocation problem. Quitting...\n" );
        return 0;
    }
    else 
        MemTotal += MemTemp;

    // allocate cube sets
    MemTemp = AllocateCubeSets( g_CoverInfo.nVarsIn, g_CoverInfo.nVarsOut );
    if ( MemTemp == 0 )
    {
        printf( "Unexpected memory allocation problem. Quitting...\n" );
        return 0;
    }
    else 
        MemTotal += MemTemp;

    // allocate adjacency queques
    MemTemp = AllocateQueques( g_CoverInfo.nCubesAlloc*g_CoverInfo.nCubesAlloc/CUBE_PAIR_FACTOR );
    if ( MemTemp == 0 )
    {
        printf( "Unexpected memory allocation problem. Quitting...\n" );
        return 0;
    }
    else 
        MemTotal += MemTemp;

    if ( g_CoverInfo.Verbosity )
    printf( "Dynamically allocated memory is %dK\n",  MemTotal/1000 );

    ///////////////////////////////////////////////////////////////////////
    // STEP 3: write the cube cover into the allocated storage
    ///////////////////////////////////////////////////////////////////////
    ///////////////////////////////////////////////////////////////////////
    clk1 = Abc_Clock();
    if ( g_CoverInfo.Verbosity )
    printf( "Generating the starting cover...\n" );
    AddCubesToStartingCover( vEsop );
    ///////////////////////////////////////////////////////////////////////

    ///////////////////////////////////////////////////////////////////////
    // STEP 4: iteratively improve the cover 
    ///////////////////////////////////////////////////////////////////////
    if ( g_CoverInfo.Verbosity )
    printf( "Performing minimization...\n" );
    clk1 = Abc_Clock();
    ReduceEsopCover();
    g_CoverInfo.TimeMin = Abc_Clock() - clk1;
//  g_Func.TimeMin = (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC);
    if ( g_CoverInfo.Verbosity )
    {
    printf( "\nMinimization time is %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeMin) );
    printf( "\nThe number of cubes after minimization is %d\n", g_CoverInfo.nCubesInUse );
    }

    ///////////////////////////////////////////////////////////////////////
    // STEP 5: save the cover into file 
    ///////////////////////////////////////////////////////////////////////
    // if option is MULTI_OUTPUT, the output is written into the output file;
    // if option is SINGLE_NODE, the output is added to the input file
    // and written into the output file; in this case, the minimized nodes is
    // also stored in the temporary file "temp.blif" for verification

    // create the file name and write the output
    {
        char Buffer[1000];
        sprintf( Buffer, "%s", pFileNameOut ? pFileNameOut : "temp.esop" );
        WriteResultIntoFile( Buffer );
        //if ( g_CoverInfo.Verbosity )
        printf( "Minimized cover has been written into file <%s>\n", Buffer );
    }

    ///////////////////////////////////////////////////////////////////////
    // STEP 6: delocate memory
    ///////////////////////////////////////////////////////////////////////
    DelocateCubeSets();
    DelocateCover();
    DelocateQueques();

    // return success
    return 1;
}